

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O2

void __thiscall
r_exec::_TPX::filter_icst_components
          (_TPX *this,ICST *icst,uint64_t icst_index,
          vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_> *components)

{
  pointer pCVar1;
  pointer pPVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  long lVar6;
  pointer pPVar7;
  ulong uVar8;
  P<r_exec::_Fact> component;
  
  uVar3 = (long)(icst->components).
                super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(icst->components).
                super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    uVar8 = uVar3;
  }
  pvVar4 = operator_new__(uVar8);
  lVar6 = 0;
  for (uVar8 = 0;
      pCVar1 = (components->
               super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(components->
                            super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 4);
      uVar8 = uVar8 + 1) {
    pPVar2 = (icst->components).
             super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pPVar7 = (icst->components).
                  super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar2; pPVar7 = pPVar7 + 1)
    {
      component.object = pPVar7->object;
      if (component.object != (_Object *)0x0) {
        LOCK();
        ((component.object)->refCount).super___atomic_base<long>._M_i =
             ((component.object)->refCount).super___atomic_base<long>._M_i + 1;
        UNLOCK();
      }
      pCVar1 = (components->
               super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pCVar1[uVar8].discarded == false) &&
         ((_Object *)pCVar1[uVar8].object == component.object)) {
        *(ulong *)((long)pvVar4 + lVar6 * 8) = uVar8;
        lVar6 = lVar6 + 1;
      }
      core::P<r_exec::_Fact>::~P(&component);
    }
  }
  if (lVar6 == 0) {
    pCVar1[icst_index].discarded = true;
  }
  else {
    for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
      pCVar1[*(long *)((long)pvVar4 + lVar5 * 8)].discarded = true;
    }
  }
  operator_delete__(pvVar4);
  return;
}

Assistant:

void _TPX::filter_icst_components(ICST *icst, uint64_t icst_index, std::vector<Component> &components)
{
    uint64_t found_component_count = 0;
    uint64_t *found = new uint64_t[icst->components.size()];

    for (uint64_t j = 0; j < components.size(); ++j) {
        for (P<_Fact> component : icst->components) {
            if (components[j].discarded) {
                continue;
            }

            if (components[j].object == component) {
                found[found_component_count] = j;
                ++found_component_count;
            }
        }
    }

    if (found_component_count > 0) { // some of the icst components are already in the inputs: discard said components, keep the icst.
        for (uint64_t i = 0; i < found_component_count; ++i) {
            components[found[i]].discarded = true;
        }
    } else { // none of the icst components are in the inputs; this can only happen because the icst shares one timestamp with the TPX's target: discard the icst.
        components[icst_index].discarded = true;
    }

    delete[] found;
}